

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles2::Functional::evalSequenceNoSideEffCase2(ShaderEvalContext *ctx)

{
  int i;
  long lVar1;
  float fVar2;
  Vector<float,_2> res;
  int local_18 [4];
  int local_8 [2];
  
  fVar2 = (float)(-(uint)(0.0 < ctx->in[0].m_data[2]) & 0x3f800000);
  local_18[0] = (int)(ctx->in[2].m_data[2] + fVar2);
  local_18[1] = (int)(fVar2 + ctx->in[2].m_data[1]);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  lVar1 = 0;
  do {
    res.m_data[lVar1] = (float)local_18[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  local_8[0] = 1;
  local_8[1] = 2;
  lVar1 = 0;
  do {
    (ctx->color).m_data[local_8[lVar1]] = res.m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

void evalSequenceNoSideEffCase2	(ShaderEvalContext& ctx) { ctx.color.yz()	= sequenceNoSideEffCase2(ctx.in[0].z() > 0.0f, ctx.in[1].x() > 0.0f, ctx.in[2].swizzle(2, 1)).asFloat(); }